

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setupUniformData
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,size_t size,void *dataPtr)

{
  int *piVar1;
  long lVar2;
  Allocator *pAVar3;
  long *plVar4;
  VkResult result;
  VkDevice_s *device;
  DeviceDriver *vk;
  undefined8 *puVar5;
  deUint64 *pdVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  deUint32 queueFamilyIndex;
  VkBufferCreateInfo uniformBufferParams;
  long *local_c8 [2];
  VkMemoryRequirements local_b8;
  deUint32 local_9c;
  Move<vk::Handle<(vk::HandleType)8>_> local_98;
  void *local_78;
  deUint32 local_6c;
  VkBufferCreateInfo local_68;
  
  local_9c = bindingLocation;
  local_78 = dataPtr;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    device = (((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  }
  else {
    device = Context::getDevice((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    vk = &((this->m_sparseContext).
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
           .m_data.ptr)->m_deviceInterface;
  }
  else {
    vk = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    local_6c = ((this->m_sparseContext).
                super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                .m_data.ptr)->m_queueFamilyIndex;
  }
  else {
    local_6c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  }
  local_68.pQueueFamilyIndices = &local_6c;
  local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.usage = 0x10;
  local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_68.queueFamilyIndexCount = 1;
  local_68.size = size;
  ::vk::createBuffer(&local_98,&vk->super_DeviceInterface,device,&local_68,
                     (VkAllocationCallbacks *)0x0);
  pAVar3 = this->m_memAlloc;
  ::vk::getBufferMemoryRequirements
            (&local_b8,&vk->super_DeviceInterface,device,
             (VkBuffer)
             local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  (*pAVar3->_vptr_Allocator[3])(local_c8,pAVar3,&local_b8,1);
  result = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xc])
                     (vk,device,
                      local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                      m_internal,local_c8[0][1],local_c8[0][2]);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x32b);
  memcpy((void *)local_c8[0][3],local_78,size);
  ::vk::flushMappedMemoryRange
            (&vk->super_DeviceInterface,device,(VkDeviceMemory)local_c8[0][1],local_c8[0][2],size);
  puVar5 = (undefined8 *)operator_new(0x48);
  *puVar5 = &PTR__BufferUniform_00d5ca20;
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  *(undefined4 *)(puVar5 + 1) = 6;
  puVar5[6] = local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  puVar5[7] = 0;
  puVar5[8] = size;
  *(deUint32 *)((long)puVar5 + 0xc) = local_9c;
  pdVar6 = (deUint64 *)operator_new(0x20);
  pdVar6[2] = (deUint64)
              local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pdVar6[3] = (deUint64)
              local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  *pdVar6 = local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pdVar6[1] = (deUint64)
              local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  plVar7 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar7 + 1) = 0;
  *(undefined4 *)((long)plVar7 + 0xc) = 0;
  *plVar7 = (long)&PTR__SharedPtrState_00d53460;
  plVar7[2] = (long)pdVar6;
  *(undefined4 *)(plVar7 + 1) = 1;
  *(undefined4 *)((long)plVar7 + 0xc) = 1;
  plVar4 = (long *)puVar5[3];
  if (plVar4 != plVar7) {
    if (plVar4 != (long *)0x0) {
      LOCK();
      plVar4 = plVar4 + 1;
      *(int *)plVar4 = (int)*plVar4 + -1;
      UNLOCK();
      if ((int)*plVar4 == 0) {
        puVar5[2] = 0;
        (**(code **)(*(long *)puVar5[3] + 0x10))();
      }
      LOCK();
      piVar1 = (int *)(puVar5[3] + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((long *)puVar5[3] != (long *)0x0) {
          (**(code **)(*(long *)puVar5[3] + 8))();
        }
        puVar5[3] = 0;
      }
    }
    puVar5[2] = pdVar6;
    puVar5[3] = plVar7;
    LOCK();
    *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(puVar5[3] + 0xc) = *(int *)(puVar5[3] + 0xc) + 1;
    UNLOCK();
  }
  LOCK();
  plVar4 = plVar7 + 1;
  *(int *)plVar4 = (int)*plVar4 + -1;
  UNLOCK();
  if ((int)*plVar4 == 0) {
    (**(code **)(*plVar7 + 0x10))(plVar7);
  }
  LOCK();
  piVar1 = (int *)((long)plVar7 + 0xc);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    (**(code **)(*plVar7 + 8))(plVar7);
  }
  plVar7 = local_c8[0];
  local_c8[0] = (long *)0x0;
  plVar8 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar8 + 1) = 0;
  *(undefined4 *)((long)plVar8 + 0xc) = 0;
  *plVar8 = (long)&PTR__SharedPtrState_00d552c8;
  plVar8[2] = (long)plVar7;
  *(undefined4 *)(plVar8 + 1) = 1;
  *(undefined4 *)((long)plVar8 + 0xc) = 1;
  plVar4 = (long *)puVar5[5];
  if (plVar4 != plVar8) {
    if (plVar4 != (long *)0x0) {
      LOCK();
      plVar4 = plVar4 + 1;
      *(int *)plVar4 = (int)*plVar4 + -1;
      UNLOCK();
      if ((int)*plVar4 == 0) {
        puVar5[4] = 0;
        (**(code **)(*(long *)puVar5[5] + 0x10))();
      }
      LOCK();
      piVar1 = (int *)(puVar5[5] + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((long *)puVar5[5] != (long *)0x0) {
          (**(code **)(*(long *)puVar5[5] + 8))();
        }
        puVar5[5] = 0;
      }
    }
    puVar5[4] = plVar7;
    puVar5[5] = plVar8;
    LOCK();
    *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(puVar5[5] + 0xc) = *(int *)(puVar5[5] + 0xc) + 1;
    UNLOCK();
  }
  LOCK();
  plVar4 = plVar8 + 1;
  *(int *)plVar4 = (int)*plVar4 + -1;
  UNLOCK();
  if ((int)*plVar4 == 0) {
    (**(code **)(*plVar8 + 0x10))(plVar8);
  }
  LOCK();
  piVar1 = (int *)((long)plVar8 + 0xc);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    (**(code **)(*plVar8 + 8))(plVar8);
  }
  puVar9 = (undefined8 *)operator_new(0x10);
  *puVar9 = puVar5;
  local_b8.alignment = 0;
  local_b8.size = (VkDeviceSize)puVar9;
  local_b8.alignment = (VkDeviceSize)operator_new(0x20);
  *(undefined4 *)(local_b8.alignment + 8) = 0;
  *(undefined4 *)(local_b8.alignment + 0xc) = 0;
  *(undefined ***)local_b8.alignment = &PTR__SharedPtrState_00d5ca60;
  *(undefined8 **)(local_b8.alignment + 0x10) = puVar9;
  *(undefined4 *)(local_b8.alignment + 8) = 1;
  *(undefined4 *)(local_b8.alignment + 0xc) = 1;
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
  ::
  emplace_back<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>
            ((vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
              *)&this->m_uniformInfos,
             (SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
              *)&local_b8);
  if ((long *)local_b8.alignment != (long *)0x0) {
    LOCK();
    plVar4 = (long *)(local_b8.alignment + 8);
    *(int *)plVar4 = (int)*plVar4 + -1;
    UNLOCK();
    if ((int)*plVar4 == 0) {
      local_b8.size = 0;
      (**(code **)(*(long *)local_b8.alignment + 0x10))();
    }
    LOCK();
    lVar2 = local_b8.alignment + 0xc;
    *(int *)lVar2 = *(int *)lVar2 + -1;
    UNLOCK();
    if (*(int *)lVar2 == 0) {
      if ((long *)local_b8.alignment != (long *)0x0) {
        (**(code **)(*(long *)local_b8.alignment + 8))();
      }
      local_b8.alignment = 0;
    }
  }
  if (local_c8[0] != (long *)0x0) {
    (**(code **)(*local_c8[0] + 8))();
    local_c8[0] = (long *)0x0;
  }
  if (local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_98.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setupUniformData (deUint32 bindingLocation, size_t size, const void* dataPtr)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const VkBufferCreateInfo		uniformBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		size,										// VkDeviceSize			size;
		VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyCount;
		&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer				= createBuffer(vk, vkDevice, &uniformBufferParams);
	de::MovePtr<Allocation>			alloc				= m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset()));

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	de::MovePtr<BufferUniform> uniformInfo(new BufferUniform());
	uniformInfo->type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
	uniformInfo->descriptor = makeDescriptorBufferInfo(*buffer, 0u, size);
	uniformInfo->location = bindingLocation;
	uniformInfo->buffer = VkBufferSp(new vk::Unique<VkBuffer>(buffer));
	uniformInfo->alloc = AllocationSp(alloc.release());

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniformInfo)));
}